

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

void __thiscall Packet::Packet(Packet *this,char *data,socket *socket,shared_ptr<KeyValueStore> *k)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  undefined1 uVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ulong uVar5;
  vector<char,_std::allocator<char>_> *in_RDX;
  void *__buf;
  FlaggedValue *this_00;
  long in_RSI;
  KeyValueStore *in_RDI;
  pair<bool,_const_FlaggedValue_&> pVar6;
  vector<char,_std::allocator<char>_> val;
  string msg;
  pair<bool,_const_FlaggedValue_&> value;
  char *in_stack_fffffffffffffe98;
  Packet *in_stack_fffffffffffffea0;
  allocator *__a;
  FlaggedValue *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  undefined6 in_stack_fffffffffffffee8;
  Packet *this_01;
  undefined4 in_stack_fffffffffffffef8;
  undefined1 found;
  KeyValueStore *fv;
  size_type *socket_00;
  undefined4 in_stack_ffffffffffffff20;
  allocator<char> local_91;
  undefined8 local_90;
  undefined8 local_88;
  allocator local_61;
  string local_60 [32];
  undefined1 local_40;
  FlaggedValue *local_38;
  vector<char,_std::allocator<char>_> *local_18;
  long local_10;
  
  fv = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x15c331);
  found = (undefined1)((ulong)(&(fv->mut).super___mutex_base._M_mutex.__align + 3) >> 0x38);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x15c344);
  socket_00 = &(fv->data)._M_h._M_bucket_count;
  uVar3 = readUInt32LE(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,0x15c36a);
  *(uint32_t *)socket_00 = uVar3;
  this_01 = (Packet *)((long)&(in_RDI->data)._M_h._M_bucket_count + 4);
  uVar4 = readUInt32LE(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,0x15c3a7);
  uVar5 = (ulong)uVar4;
  *(uint32_t *)&(this_01->key).super__Vector_base<char,_std::allocator<char>_>._M_impl = uVar4;
  __first._M_current = (char *)((long)&(in_RDI->data)._M_h._M_before_begin._M_nxt + 4);
  uVar2 = readUInt16LE(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,0x15c3db);
  *(uint16_t *)&(((KeyValueStore *)__first._M_current)->mut).super___mutex_base._M_mutex = uVar2;
  *(undefined1 *)((long)&(in_RDI->data)._M_h._M_element_count + 1) = *(undefined1 *)(local_10 + 1);
  *(int *)((long)&(in_RDI->data)._M_h._M_element_count + 4) = (int)*(char *)(local_10 + 4);
  read((Packet *)in_RDI,(int)local_18,__buf,CONCAT62((int6)(uVar5 >> 0x10),uVar2));
  if (*(char *)(local_10 + 1) == '\0') {
    std::__shared_ptr_access<KeyValueStore,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<KeyValueStore,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x15c442);
    pVar6 = KeyValueStore::get(in_RDI,(vector<char,_std::allocator<char>_> *)
                                      CONCAT44(uVar4,in_stack_fffffffffffffef8));
    this_00 = pVar6.second;
    uVar1 = pVar6.first;
    local_40 = uVar1;
    local_38 = this_00;
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __a = &local_61;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"Key not found",__a);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      local_88 = std::__cxx11::string::cbegin();
      local_90 = std::__cxx11::string::cend();
      std::allocator<char>::allocator();
      __last._M_current._7_1_ = uVar1;
      __last._M_current._0_7_ = in_stack_fffffffffffffed8;
      std::vector<char,std::allocator<char>>::
      vector<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                (&this_00->value,__first,__last,(allocator_type *)__a);
      std::allocator<char>::~allocator(&local_91);
      std::vector<char,_std::allocator<char>_>::vector
                (&this_01->key,
                 (vector<char,_std::allocator<char>_> *)CONCAT26(uVar2,in_stack_fffffffffffffee8));
      respondToGet((Packet *)CONCAT44(uVar3,in_stack_ffffffffffffff20),(socket *)socket_00,
                   (FlaggedValue *)fv,(bool)found);
      FlaggedValue::~FlaggedValue((FlaggedValue *)0x15c5bb);
      std::vector<char,_std::allocator<char>_>::~vector(local_18);
      std::__cxx11::string::~string(local_60);
    }
    else {
      respondToGet((Packet *)CONCAT44(uVar3,in_stack_ffffffffffffff20),(socket *)socket_00,
                   (FlaggedValue *)fv,(bool)found);
    }
  }
  else if (*(char *)(local_10 + 1) == '\x01') {
    std::__shared_ptr_access<KeyValueStore,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<KeyValueStore,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x15c6a0);
    std::vector<char,_std::allocator<char>_>::vector
              (&this_01->key,
               (vector<char,_std::allocator<char>_> *)CONCAT26(uVar2,in_stack_fffffffffffffee8));
    KeyValueStore::set((KeyValueStore *)__first._M_current,
                       (vector<char,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8),
                       in_stack_fffffffffffffed0);
    FlaggedValue::~FlaggedValue((FlaggedValue *)0x15c6fa);
    respondToSet(this_01,(socket *)CONCAT26(uVar2,in_stack_fffffffffffffee8));
  }
  return;
}

Assistant:

Packet::Packet(char data[24], socket& socket,
               const std::shared_ptr<KeyValueStore>& k)
    : bod_len(readUInt32LE(data, 8)),
      opaque(readUInt32LE(data, 12)),
      key_len(readUInt16LE(data, 2)),
      op(data[1]),
      ext_len(data[4]) {

  read(socket);
  if (data[1] == static_cast<char>(OpCode::GET)) {
    std::pair<bool, const FlaggedValue&> value{ k->get(key) };
    if (value.first) {
      respondToGet(socket, value.second, true);
    } else {
      std::string msg = "Key not found";
      std::vector<char> val(msg.cbegin(), msg.cend());
      respondToGet(socket, FlaggedValue{ val, 0 }, false);
    }
  } else if (data[1] == static_cast<char>(OpCode::SET)) {
    k->set(key, FlaggedValue{ val, flags });
    respondToSet(socket);
  }
}